

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_block.h
# Opt level: O0

void __thiscall
shift_window_transformer::SwinBlock<float>::forward
          (SwinBlock<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  undefined1 local_50 [8];
  Tensor<float> tmp;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  SwinBlock<float> *this_local;
  
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)output;
  Tensor<float>::Tensor((Tensor<float> *)local_50);
  (*(code *)**(undefined8 **)this->residual1)(this->residual1,input,(Tensor<float> *)local_50);
  (*(code *)**(undefined8 **)this->residual2)
            (this->residual2,local_50,
             tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  Tensor<float>::~Tensor((Tensor<float> *)local_50);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            residual1->forward(input, tmp);
            residual2->forward(tmp, output);
        }